

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pci.c
# Opt level: O0

int pci_open_resource(char *pci_addr,char *resource,int flags)

{
  int iVar1;
  int *piVar2;
  int in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  char buf [512];
  int err;
  int64_t result;
  int fd;
  char path [4096];
  undefined1 local_1238 [524];
  int local_102c;
  long local_1028;
  char local_1018 [4100];
  int local_14;
  
  local_14 = in_EDX;
  snprintf(local_1018,0x1000,"/sys/bus/pci/devices/%s/%s",in_RDI,in_RSI);
  fprintf(_stderr,"[DEBUG] %s:%d %s(): Opening PCI resource at %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x3a,
          "pci_open_resource",local_1018);
  iVar1 = open(local_1018,local_14);
  local_1028 = (long)iVar1;
  if (local_1028 == -1) {
    piVar2 = __errno_location();
    local_102c = *piVar2;
    __xpg_strerror_r(local_102c,local_1238,0x200);
    fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x3b,
            "pci_open_resource","open pci resource",local_1238);
    exit(local_102c);
  }
  return iVar1;
}

Assistant:

int pci_open_resource(const char* pci_addr, const char* resource, int flags) {
	char path[PATH_MAX];
	snprintf(path, PATH_MAX, "/sys/bus/pci/devices/%s/%s", pci_addr, resource);
	debug("Opening PCI resource at %s", path);
	int fd = check_err(open(path, flags), "open pci resource");
	return fd;
}